

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void testing::Test::RecordProperty(string *key,int value)

{
  Message value_message;
  allocator local_61;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  string local_58;
  string local_38;
  
  Message::Message((Message *)&local_60);
  std::ostream::operator<<(local_60.ptr_ + 0x10,value);
  internal::StringStreamToString(&local_58,local_60.ptr_);
  std::__cxx11::string::string((string *)&local_38,local_58._M_dataplus._M_p,&local_61);
  RecordProperty(key,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_60);
  return;
}

Assistant:

void Test::RecordProperty(const std::string& key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}